

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O2

void __thiscall
Qentem::
HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
::RemoveIndex(HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
              *this,SizeT index)

{
  if (index < this->index_) {
    if (this->hashTable_[(ulong)this->capacity_ + (ulong)index * 0xc + 4] != 0) {
      remove(this,*(char **)(this->hashTable_ + (ulong)this->capacity_ + (ulong)index * 0xc));
      return;
    }
  }
  return;
}

Assistant:

void RemoveIndex(const SizeT index) const noexcept {
        if (index < Size()) {
            const HItem *item = (Storage() + index);

            if (item->Hash != 0) {
                remove(item->Key.First(), item->Key.Length(), item->Hash);
            }
        }
    }